

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::RegisterMulticastListener
          (CommissionerImpl *this,Handler<uint8_t> *aHandler,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ByteArray *pBVar4;
  Error *pEVar5;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  Error local_7c8;
  ErrorCode local_7a0;
  anon_class_1_0_00000001 local_79a;
  v10 local_799;
  v10 *local_798;
  size_t local_790;
  string local_788;
  allocator local_761;
  string local_760;
  ResponseHandler local_740;
  ErrorCode local_71c;
  Error local_718;
  ErrorCode local_6ec;
  Tlv local_6e8;
  Error local_6c8;
  ErrorCode local_69c;
  Tlv local_698;
  Error local_678;
  ErrorCode local_64c;
  Tlv local_648;
  Error local_628;
  ErrorCode local_600;
  allocator local_5f9;
  string local_5f8;
  Error local_5d8;
  anon_class_1_0_00000001 local_5aa;
  v10 local_5a9;
  v10 *local_5a8;
  size_t local_5a0;
  string local_598;
  Error local_578;
  uchar *local_550;
  uchar *local_548;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_540;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_538;
  const_iterator local_530;
  string local_528;
  anon_class_1_0_00000001 local_502;
  v10 local_501;
  v10 *local_500;
  char *local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  Error local_4d0;
  ErrorCode local_4a4;
  Error local_4a0;
  reference local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *addr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  v10 *local_450;
  size_t local_448;
  string local_440;
  Error local_420;
  undefined1 local_3f8 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_3c8 [8];
  Request request;
  ByteArray rawAddresses;
  Address multicastAddr;
  Error error;
  uint32_t aTimeout_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aMulticastAddrList_local;
  Handler<uint8_t> *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  ulong local_298;
  v10 *local_290;
  size_t sStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  ulong local_248;
  v10 *local_240;
  size_t sStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_228 [3];
  undefined1 local_210 [16];
  v10 *local_200;
  ulong local_1f8;
  v10 *local_1f0;
  size_t sStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  v10 *local_1b0;
  char *local_1a8;
  string *local_1a0;
  v10 *local_198;
  char *pcStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  CommissionerImpl **local_90;
  undefined1 *local_88;
  CommissionerImpl **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  CommissionerImpl **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  Error::Error((Error *)&multicastAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)
                   &rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  coap::Message::Message((Message *)local_3c8,kConfirmable,kPost);
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            ((function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *)local_3f8,aHandler);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(aMulticastAddrList);
  if (bVar1) {
    RegisterMulticastListener::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&__range2 + 6));
    local_178 = &local_450;
    local_180 = (v10 *)((long)&__range2 + 7);
    bVar6 = ::fmt::v10::operator()(local_180);
    local_448 = bVar6.size_;
    local_450 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_1e0 = &local_440;
    local_1f0 = local_450;
    sStack_1e8 = local_448;
    local_140 = &local_1f0;
    local_200 = local_450;
    local_1f8 = local_448;
    local_138 = local_200;
    sStack_130 = local_1f8;
    local_228[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_d8 = local_210;
    local_e0 = local_228;
    local_c8 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_e0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1f8;
    local_d0 = local_e0;
    local_c0 = local_d8;
    local_58 = local_e0;
    ::fmt::v10::vformat_abi_cxx11_(&local_440,local_200,fmt,args);
    Error::Error(&local_420,kInvalidArgs,&local_440);
    Error::operator=((Error *)&multicastAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_420);
    Error::~Error(&local_420);
    std::__cxx11::string::~string((string *)&local_440);
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(aMulticastAddrList);
    addr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(aMulticastAddrList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&addr), bVar1) {
      local_478 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      Address::Set(&local_4a0,
                   (Address *)
                   &rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_478);
      pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_4a0);
      local_4a4 = kNone;
      bVar1 = commissioner::operator!=(pEVar5,&local_4a4);
      Error::~Error(&local_4a0);
      if (bVar1) goto LAB_0024fdd0;
      bVar1 = Address::IsIpv6((Address *)
                              &rawAddresses.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((!bVar1) ||
         (bVar1 = Address::IsMulticast
                            ((Address *)
                             &rawAddresses.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)) {
        RegisterMulticastListener::anon_class_1_0_00000001::operator()(&local_502);
        local_168 = &local_500;
        local_170 = &local_501;
        bVar6 = ::fmt::v10::operator()(local_170);
        local_4f8 = (char *)bVar6.size_;
        local_500 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        this_00 = (v10 *)&rawAddresses.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
        Address::ToString_abi_cxx11_(&local_528,(Address *)this_00);
        local_188 = &local_4f0;
        local_198 = local_500;
        pcStack_190 = local_4f8;
        local_1a0 = &local_528;
        local_20 = &local_198;
        local_1b0 = local_500;
        local_1a8 = local_4f8;
        local_18 = local_1b0;
        pcStack_10 = local_1a8;
        local_1d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_1a0,this_00,local_188);
        local_48 = local_1c0;
        local_50 = local_1d8;
        local_38 = 0xd;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_50;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_1a8;
        local_40 = local_50;
        local_30 = local_48;
        local_28 = local_50;
        ::fmt::v10::vformat_abi_cxx11_(&local_4f0,local_1b0,fmt_00,args_00);
        Error::Error(&local_4d0,kInvalidArgs,&local_4f0);
        Error::operator=((Error *)&multicastAddr.mBytes.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4d0);
        Error::~Error(&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_528);
        goto LAB_0024fdd0;
      }
      local_538._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &request.mEndpoint);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_530,&local_538);
      pBVar4 = Address::GetRaw((Address *)
                               &rawAddresses.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_540._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pBVar4);
      pBVar4 = Address::GetRaw((Address *)
                               &rawAddresses.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_548 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pBVar4);
      local_550 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                      &request.mEndpoint,local_530,local_540,
                                      (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_548);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
    if ((uVar2 & 1) == 0) {
      RegisterMulticastListener::anon_class_1_0_00000001::operator()(&local_5aa);
      local_158 = &local_5a8;
      local_160 = &local_5a9;
      bVar6 = ::fmt::v10::operator()(local_160);
      local_5a0 = bVar6.size_;
      local_5a8 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_230 = &local_598;
      local_240 = local_5a8;
      sStack_238 = local_5a0;
      local_120 = &local_240;
      local_250 = local_5a8;
      local_248 = local_5a0;
      local_118 = local_250;
      sStack_110 = local_248;
      local_278[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_b0 = local_260;
      local_b8 = local_278;
      local_a0 = 0;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_b8;
      fmt_01.size_ = 0;
      fmt_01.data_ = (char *)local_248;
      local_a8 = local_b8;
      local_98 = local_b0;
      local_60 = local_b8;
      ::fmt::v10::vformat_abi_cxx11_(&local_598,local_250,fmt_01,args_01);
      Error::Error(&local_578,kInvalidState,&local_598);
      Error::operator=((Error *)&multicastAddr.mBytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&local_578);
      Error::~Error(&local_578);
      std::__cxx11::string::~string((string *)&local_598);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5f8,"/n/mr",&local_5f9);
      coap::Message::SetUriPath(&local_5d8,(Message *)local_3c8,&local_5f8);
      pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_5d8);
      local_600 = kNone;
      bVar1 = commissioner::operator!=(pEVar5,&local_600);
      Error::~Error(&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
      if (!bVar1) {
        iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv(&local_648,kCommissionerUdpPort,(uint16_t)iVar3,kThread);
        AppendTlv(&local_628,(Message *)local_3c8,&local_648);
        pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &local_628);
        local_64c = kNone;
        bVar1 = commissioner::operator!=(pEVar5,&local_64c);
        Error::~Error(&local_628);
        tlv::Tlv::~Tlv(&local_648);
        if (!bVar1) {
          tlv::Tlv::Tlv(&local_698,kCommissionerSessionId,aTimeout,kThread);
          AppendTlv(&local_678,(Message *)local_3c8,&local_698);
          pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_678);
          local_69c = kNone;
          bVar1 = commissioner::operator!=(pEVar5,&local_69c);
          Error::~Error(&local_678);
          tlv::Tlv::~Tlv(&local_698);
          if (!bVar1) {
            tlv::Tlv::Tlv(&local_6e8,kActiveTimestamp,(ByteArray *)&request.mEndpoint,kThread);
            AppendTlv(&local_6c8,(Message *)local_3c8,&local_6e8);
            pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_6c8);
            local_6ec = kNone;
            bVar1 = commissioner::operator!=(pEVar5,&local_6ec);
            Error::~Error(&local_6c8);
            tlv::Tlv::~Tlv(&local_6e8);
            if (!bVar1) {
              uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
              if ((uVar2 & 1) != 0) {
                SignRequest(&local_718,this,(Request *)local_3c8,kMeshCoP,true);
                pEVar5 = Error::operator=((Error *)&multicastAddr.mBytes.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ,&local_718);
                local_71c = kNone;
                bVar1 = commissioner::operator!=(pEVar5,&local_71c);
                Error::~Error(&local_718);
                if (bVar1) goto LAB_0024fdd0;
              }
              std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
              function<ot::commissioner::CommissionerImpl::RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)::__0&,void>
                        ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                          *)&local_740,(anon_class_32_1_d0c21527 *)local_3f8);
              ProxyClient::SendRequest
                        (&this->mProxyClient,(Request *)local_3c8,&local_740,0xfc38,0xf0bf);
              std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>
              ::~function(&local_740);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_760,"mgmt",&local_761);
              RegisterMulticastListener::anon_class_1_0_00000001::operator()(&local_79a);
              local_148 = &local_798;
              local_150 = &local_799;
              bVar6 = ::fmt::v10::operator()(local_150);
              local_790 = bVar6.size_;
              local_798 = (v10 *)bVar6.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_280 = &local_788;
              local_290 = local_798;
              sStack_288 = local_790;
              local_100 = &local_290;
              local_2a0 = local_798;
              local_298 = local_790;
              local_f8 = local_2a0;
              sStack_f0 = local_298;
              this_local = (CommissionerImpl *)
                           ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
              local_88 = local_2b0;
              local_90 = &this_local;
              local_78 = 0;
              args_02.field_1.values_ = in_R9.values_;
              args_02.desc_ = (unsigned_long_long)local_90;
              fmt_02.size_ = 0;
              fmt_02.data_ = (char *)local_298;
              local_80 = local_90;
              local_70 = local_88;
              local_68 = local_90;
              ::fmt::v10::vformat_abi_cxx11_(&local_788,local_2a0,fmt_02,args_02);
              Log(kDebug,&local_760,&local_788);
              std::__cxx11::string::~string((string *)&local_788);
              std::__cxx11::string::~string((string *)&local_760);
              std::allocator<char>::~allocator((allocator<char> *)&local_761);
            }
          }
        }
      }
    }
  }
LAB_0024fdd0:
  local_7a0 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&multicastAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7a0);
  if (bVar1) {
    Error::Error(&local_7c8,
                 (Error *)&multicastAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::operator()
              (aHandler,(uchar *)0x0,&local_7c8);
    Error::~Error(&local_7c8);
  }
  RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)
  ::$_0::~__0((__0 *)local_3f8);
  coap::Message::~Message((Message *)local_3c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  Address::~Address((Address *)
                    &rawAddresses.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  Error::~Error((Error *)&multicastAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::RegisterMulticastListener(Handler<uint8_t>                aHandler,
                                                 const std::vector<std::string> &aMulticastAddrList,
                                                 uint32_t                        aTimeout)
{
    Error     error;
    Address   multicastAddr;
    ByteArray rawAddresses;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error       error;
        tlv::TlvPtr statusTlv = nullptr;
        uint8_t     status;

        SuccessOrExit(error = aError);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
        LOG_INFO(LOG_REGION_THCI, "received MLR.rsp: {}", utils::Hex(aResponse->GetPayload()));
#endif

        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        statusTlv = GetTlv(tlv::Type::kThreadStatus, *aResponse, tlv::Scope::kThread);
        VerifyOrExit(statusTlv != nullptr, error = ERROR_BAD_FORMAT("no valid State TLV found in response"));

        status = statusTlv->GetValueAsUint8();
        aHandler(&status, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(!aMulticastAddrList.empty(), error = ERROR_INVALID_ARGS("Multicast Address List cannot be empty"));

    for (const auto &addr : aMulticastAddrList)
    {
        SuccessOrExit(error = multicastAddr.Set(addr));
        VerifyOrExit(multicastAddr.IsIpv6() && multicastAddr.IsMulticast(),
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 multicast address", multicastAddr.ToString()));
        rawAddresses.insert(rawAddresses.end(), multicastAddr.GetRaw().begin(), multicastAddr.GetRaw().end());
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMlr));
    SuccessOrExit(
        error = AppendTlv(request, {tlv::Type::kThreadCommissionerSessionId, GetSessionId(), tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadTimeout, aTimeout, tlv::Scope::kThread}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kThreadIpv6Addresses, rawAddresses, tlv::Scope::kThread}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kPrimaryBbrAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MLR.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}